

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall lexer::Lexer::Lexer(Lexer *this,LexerRules *lexerRules)

{
  pointer pvVar1;
  _Base_ptr p_Var2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  vector<lexer::Transition,_std::allocator<lexer::Transition>_> lexerState;
  char local_69;
  vector<lexer::Transition,_std::allocator<lexer::Transition>_> local_68;
  _Base_ptr local_48;
  _Base_ptr local_40;
  _Rb_tree_node_base *local_38;
  
  (this->lexerStateMachine).
  super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lexerStateMachine).
  super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lexerStateMachine).
  super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
  ::resize(&this->lexerStateMachine,(lexerRules->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  p_Var5 = (lexerRules->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48 = &(lexerRules->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_48) {
    do {
      local_68.super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::resize(&local_68,0xff);
      p_Var4 = *(_Rb_tree_node_base **)(p_Var5 + 2);
      local_38 = (_Rb_tree_node_base *)&p_Var5[1]._M_left;
      local_40 = p_Var5;
      if (p_Var4 != local_38) {
        do {
          if ((char)p_Var4[2]._M_color == _S_black) {
            if (p_Var4[1]._M_parent != (_Base_ptr)0x0) {
              pcVar9 = *(char **)(p_Var4 + 1);
              do {
                updateTransition(this,&local_68,(Transition *)&p_Var4[2]._M_parent,*pcVar9);
                pcVar9 = pcVar9 + 1;
              } while (pcVar9 != (char *)((long)&(p_Var4[1]._M_parent)->_M_color +
                                         *(long *)(p_Var4 + 1)));
            }
          }
          else {
            local_69 = '\0';
            do {
              _Var3 = std::
                      __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (*(long *)(p_Var4 + 1),
                                 (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1),
                                 &local_69);
              if (_Var3._M_current ==
                  (char *)((long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1))) {
                updateTransition(this,&local_68,(Transition *)&p_Var4[2]._M_parent,local_69);
              }
              local_69 = local_69 + '\x01';
            } while (-1 < local_69);
          }
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        } while (p_Var4 != local_38);
      }
      p_Var5 = local_40;
      uVar8 = (ulong)(int)local_40[1]._M_color;
      pvVar1 = (this->lexerStateMachine).
               super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->lexerStateMachine).
                     super__Vector_base<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
        uVar6 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
        std::
        vector<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>,_std::allocator<std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>_>_>
        ::~vector(&this->lexerStateMachine);
        _Unwind_Resume(uVar6);
      }
      std::vector<lexer::Transition,_std::allocator<lexer::Transition>_>::operator=
                (pvVar1 + uVar8,&local_68);
      p_Var2 = local_48;
      if (local_68.super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.
                        super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<lexer::Transition,_std::allocator<lexer::Transition>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != p_Var2);
  }
  return;
}

Assistant:

explicit Lexer(LexerRules const &lexerRules) {
            lexerStateMachine.resize(lexerRules.size());

            size_t maxChar = std::numeric_limits<uint8_t>::max();

            for_each_c (LexerRules, lexerRules, rule) {
                std::vector<Transition> lexerState;

                lexerState.resize(static_cast<size_t>(maxChar));

                for_each_c (LexerRule, rule->second, transition) {
                    if (transition->first.inSet)
                        for_each_c (std::string, transition->first.chars, c)
                            updateTransition(lexerState, transition->second, *c);
                    else
                        for (char c = 0; c < maxChar; ++c)
                            if (std::find(transition->first.chars.begin(),
                                          transition->first.chars.end(), c) == transition->first.chars.end())
                                updateTransition(lexerState, transition->second, c);
                }

                lexerStateMachine.at(static_cast<size_t>(rule->first)) = lexerState;
            }
        }